

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

void __thiscall jsonip::semantic_state::pre(semantic_state *this)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  value_type local_28;
  reference local_18;
  state_t *array_state;
  semantic_state *this_local;
  
  array_state = (state_t *)this;
  sVar2 = std::
          vector<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
          ::size(&this->state);
  if (sVar2 == 0) {
    __assert_fail("state.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/catedrasaes-umu[P]jsonip/jsonip/parse.hpp"
                  ,0x12,"void jsonip::semantic_state::pre()");
  }
  this_00 = std::
            vector<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
            ::back(&this->state);
  bVar1 = holder::valid(&this_00->first);
  if (!bVar1) {
    sVar2 = std::
            vector<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
            ::size(&this->state);
    if (sVar2 < 2) {
      __assert_fail("state.size() > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/catedrasaes-umu[P]jsonip/jsonip/parse.hpp"
                    ,0x16,"void jsonip::semantic_state::pre()");
    }
    sVar2 = std::
            vector<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
            ::size(&this->state);
    local_18 = std::
               vector<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
               ::operator[](&this->state,sVar2 - 2);
    (**(code **)(*(long *)local_18->second + 0x48))(&local_28,local_18->second,local_18);
    std::
    vector<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
    ::push_back(&this->state,&local_28);
  }
  return;
}

Assistant:

void pre()
        {
            assert(state.size());
            if (state.back().first.valid())
                return;

            assert(state.size() > 1);
            state_t& array_state = state[state.size() - 2];
            state.push_back(array_state.second->new_child(array_state.first));
        }